

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_result * __thiscall
pugi::xml_document::load_file
          (xml_parse_result *__return_storage_ptr__,xml_document *this,char *path_,uint options,
          xml_encoding encoding)

{
  FILE *data_;
  undefined1 local_30 [8];
  auto_deleter<_IO_FILE> file;
  xml_encoding encoding_local;
  uint options_local;
  char *path__local;
  xml_document *this_local;
  
  file.deleter._0_4_ = encoding;
  file.deleter._4_4_ = options;
  reset(this);
  data_ = fopen(path_,"rb");
  impl::anon_unknown_0::auto_deleter<_IO_FILE>::auto_deleter
            ((auto_deleter<_IO_FILE> *)local_30,(_IO_FILE *)data_,impl::anon_unknown_0::close_file);
  impl::anon_unknown_0::load_file_impl
            (__return_storage_ptr__,(xml_document_struct *)(this->super_xml_node)._root,
             (FILE *)local_30,file.deleter._4_4_,(xml_encoding)file.deleter,&this->_buffer);
  impl::anon_unknown_0::auto_deleter<_IO_FILE>::~auto_deleter((auto_deleter<_IO_FILE> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN xml_parse_result xml_document::load_file(const char* path_, unsigned int options, xml_encoding encoding)
	{
		reset();

		using impl::auto_deleter; // MSVC7 workaround
		auto_deleter<FILE> file(fopen(path_, "rb"), impl::close_file);

		return impl::load_file_impl(static_cast<impl::xml_document_struct*>(_root), file.data, options, encoding, &_buffer);
	}